

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall CVmObjVector::equals(CVmObjVector *this,vm_obj_id_t self,vm_val_t *val,int depth)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  size_t in_RDI;
  vm_val_t val2;
  vm_val_t val1;
  int idx;
  int cnt2;
  int cnt;
  CVmObjVector *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  int iVar4;
  int local_4;
  
  if (0x100 < in_ECX) {
    err_throw(0);
  }
  if ((*in_RDX == 5) && (in_RDX[2] == in_ESI)) {
    local_4 = 1;
  }
  else {
    iVar1 = vm_val_t::is_listlike
                      ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if ((iVar1 != 0) &&
       (iVar1 = vm_val_t::ll_length((vm_val_t *)
                                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
       -1 < iVar1)) {
      sVar3 = get_element_count((CVmObjVector *)0x3a3340);
      if ((int)sVar3 != iVar1) {
        return 0;
      }
      iVar4 = 0;
      while( true ) {
        if ((int)sVar3 <= iVar4) {
          return 1;
        }
        get_element(in_stack_ffffffffffffffb0,in_RDI,(vm_val_t *)0x3a337d);
        vm_val_t::ll_index((vm_val_t *)CONCAT44(iVar1,iVar4),in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc4);
        iVar2 = vm_val_t::equals(in_stack_ffffffffffffffc8,
                                 (vm_val_t *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffbc);
        if (iVar2 == 0) break;
        iVar4 = iVar4 + 1;
      }
      return 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmObjVector::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                         int depth) const
{
    int cnt;
    int cnt2;
    int idx;

    /* if the recursion depth is excessive, throw an error */
    if (depth > VM_MAX_TREE_DEPTH_EQ)
        err_throw(VMERR_TREE_TOO_DEEP_EQ);

    /* if the other value is a reference to myself, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
    {
        /* no need to look at the contents if this is a reference to me */
        return TRUE;
    }

    /* if it's not list-like, it's not a match */
    if (!val->is_listlike(vmg0_) || (cnt2 = val->ll_length(vmg0_)) < 0)
        return FALSE;

    /* if the sizes don't match, the values are not equal */
    cnt = get_element_count();
    if (cnt != cnt2)
        return FALSE;

    /* compare element by element */
    for (idx = 0 ; idx < cnt ; ++idx)
    {
        vm_val_t val1;
        vm_val_t val2;
        
        /* get this element of self */
        get_element(idx, &val1);

        /* get this element of the other value */
        val->ll_index(vmg_ &val2, idx + 1);
        
        /* if these elements aren't equal, our values aren't equal */
        if (!val1.equals(vmg_ &val2, depth + 1))
            return FALSE;
    }

    /* we didn't find any differences, so the values are equal */
    return TRUE;
}